

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::FragmentOutputCase::init(FragmentOutputCase *this,EVP_PKEY_CTX *ctx)

{
  code *pcVar1;
  const_iterator this_00;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *contextInfo;
  pointer pBVar7;
  ShaderProgram *pSVar8;
  TestError *pTVar9;
  size_type sVar10;
  MessageBuilder *pMVar11;
  reference pvVar12;
  reference pvVar13;
  NotSupportedError *pNVar14;
  char *message;
  Enum<int,_2UL> EVar15;
  GetNameFunc local_338;
  int local_330;
  string local_328;
  allocator<char> local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  int local_2c0;
  int local_2bc;
  deUint32 fboStatus;
  deUint32 attachment;
  BufferSpec *bufSpec;
  int local_2a8;
  deUint32 rbo;
  int bufNdx;
  int local_298;
  Enum<int,_2UL> local_290;
  MessageBuilder local_280;
  int local_100;
  allocator<char> local_f9;
  int ndx;
  allocator<char> local_d1;
  string local_d0;
  LogSection local_b0;
  undefined1 local_6d;
  allocator<char> local_59;
  string local_58;
  __normal_iterator<deqp::gles3::Functional::BufferSpec_*,_std::vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>_>
  local_38;
  __normal_iterator<deqp::gles3::Functional::BufferSpec_*,_std::vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>_>
  local_30;
  __normal_iterator<const_deqp::gles3::Functional::BufferSpec_*,_std::vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>_>
  local_28;
  const_iterator bufIter;
  TestLog *log;
  Functions *gl;
  FragmentOutputCase *this_local;
  long lVar6;
  
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  bufIter._M_current =
       (BufferSpec *)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  local_30._M_current =
       (BufferSpec *)
       std::
       vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
       ::begin(&this->m_fboSpec);
  __gnu_cxx::
  __normal_iterator<deqp::gles3::Functional::BufferSpec_const*,std::vector<deqp::gles3::Functional::BufferSpec,std::allocator<deqp::gles3::Functional::BufferSpec>>>
  ::__normal_iterator<deqp::gles3::Functional::BufferSpec*>
            ((__normal_iterator<deqp::gles3::Functional::BufferSpec_const*,std::vector<deqp::gles3::Functional::BufferSpec,std::allocator<deqp::gles3::Functional::BufferSpec>>>
              *)&local_28,&local_30);
  while( true ) {
    local_38._M_current =
         (BufferSpec *)
         std::
         vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
         ::end(&this->m_fboSpec);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar2) break;
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    contextInfo = gles3::Context::getContextInfo((this->super_TestCase).m_context);
    pBVar7 = __gnu_cxx::
             __normal_iterator<const_deqp::gles3::Functional::BufferSpec_*,_std::vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>_>
             ::operator->(&local_28);
    bVar2 = glu::isSizedFormatColorRenderable(pRVar5,contextInfo,pBVar7->format);
    if (!bVar2) {
      local_6d = 1;
      pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Unsupported attachment format",&local_59);
      tcu::NotSupportedError::NotSupportedError(pNVar14,&local_58);
      local_6d = 0;
      __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    __gnu_cxx::
    __normal_iterator<const_deqp::gles3::Functional::BufferSpec_*,_std::vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>_>
    ::operator++(&local_28);
  }
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  pSVar8 = Functional::createProgram(pRVar5,&this->m_outputs);
  this->m_program = pSVar8;
  glu::operator<<((TestLog *)bufIter._M_current,this->m_program);
  bVar2 = glu::ShaderProgram::isOk(this->m_program);
  this_00 = bufIter;
  if (!bVar2) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x101);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Framebuffer",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Framebuffer configuration",&local_f9);
  tcu::LogSection::LogSection(&local_b0,&local_d0,(string *)&ndx);
  tcu::TestLog::operator<<((TestLog *)this_00._M_current,&local_b0);
  tcu::LogSection::~LogSection(&local_b0);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  local_100 = 0;
  while( true ) {
    iVar3 = local_100;
    sVar10 = std::
             vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
             ::size(&this->m_fboSpec);
    if ((int)sVar10 <= iVar3) break;
    tcu::TestLog::operator<<
              (&local_280,(TestLog *)bufIter._M_current,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    pMVar11 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [17])0x2a791b5);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_100);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a18ff4);
    pvVar12 = std::
              vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ::operator[](&this->m_fboSpec,(long)local_100);
    EVar15 = glu::getTextureFormatStr(pvVar12->format);
    _bufNdx = EVar15.m_getName;
    local_298 = EVar15.m_value;
    local_290.m_getName = _bufNdx;
    local_290.m_value = local_298;
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_290);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
    pvVar12 = std::
              vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ::operator[](&this->m_fboSpec,(long)local_100);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&pvVar12->width);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a9098a);
    pvVar12 = std::
              vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ::operator[](&this->m_fboSpec,(long)local_100);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&pvVar12->height);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [3])0x2a4b1eb);
    pvVar12 = std::
              vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
              ::operator[](&this->m_fboSpec,(long)local_100);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&pvVar12->samples);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [9])0x2c2eb41);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_280);
    local_100 = local_100 + 1;
  }
  tcu::TestLog::operator<<
            ((TestLog *)bufIter._M_current,(EndSectionToken *)&tcu::TestLog::EndSection);
  sVar10 = std::
           vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
           ::size(&this->m_fboSpec);
  rbo = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->m_renderbuffers,sVar10,&rbo);
  (**(code **)(lVar6 + 0x6d0))(1,&this->m_framebuffer);
  pcVar1 = *(code **)(lVar6 + 0x6e8);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_renderbuffers);
  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      (&this->m_renderbuffers,0);
  (*pcVar1)(sVar10 & 0xffffffff,pvVar13);
  (**(code **)(lVar6 + 0x78))(0x8d40,this->m_framebuffer);
  local_2a8 = 0;
  while( true ) {
    iVar3 = local_2a8;
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_renderbuffers);
    if ((int)sVar10 <= iVar3) break;
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_renderbuffers,(long)local_2a8);
    bufSpec._4_4_ = *pvVar13;
    _fboStatus = std::
                 vector<deqp::gles3::Functional::BufferSpec,_std::allocator<deqp::gles3::Functional::BufferSpec>_>
                 ::operator[](&this->m_fboSpec,(long)local_2a8);
    local_2bc = local_2a8 + 0x8ce0;
    (**(code **)(lVar6 + 0xa0))(0x8d41,bufSpec._4_4_);
    (**(code **)(lVar6 + 0x1240))
              (0x8d41,_fboStatus->samples,_fboStatus->format,_fboStatus->width,_fboStatus->height);
    (**(code **)(lVar6 + 0x688))(0x8d40,local_2bc,0x8d41,bufSpec._4_4_);
    local_2a8 = local_2a8 + 1;
  }
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"After framebuffer setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x120);
  local_2c0 = (**(code **)(lVar6 + 0x170))(0x8d40);
  if (local_2c0 == 0x8cdd) {
    pNVar14 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar14,"Framebuffer not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x124);
    __cxa_throw(pNVar14,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (local_2c0 != 0x8cd5) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"Incomplete framebuffer: ",&local_301);
    EVar15 = glu::getFramebufferStatusStr(local_2c0);
    local_338 = EVar15.m_getName;
    local_330 = EVar15.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_328,&local_338);
    std::operator+(&local_2e0,&local_300,&local_328);
    message = (char *)std::__cxx11::string::c_str();
    tcu::TestError::TestError
              (pTVar9,message,"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
               ,0x126);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar6 + 0x78))(0x8d40,0);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"After init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFragmentOutputTests.cpp"
                  ,0x129);
  return extraout_EAX;
}

Assistant:

void FragmentOutputCase::init (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	// Check that all attachments are supported
	for (std::vector<BufferSpec>::const_iterator bufIter = m_fboSpec.begin(); bufIter != m_fboSpec.end(); ++bufIter)
	{
		if (!glu::isSizedFormatColorRenderable(m_context.getRenderContext(), m_context.getContextInfo(), bufIter->format))
			throw tcu::NotSupportedError("Unsupported attachment format");
	}

	DE_ASSERT(!m_program);
	m_program = createProgram(m_context.getRenderContext(), m_outputs);

	log << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Compile failed");

	// Print render target info to log.
	log << TestLog::Section("Framebuffer", "Framebuffer configuration");

	for (int ndx = 0; ndx < (int)m_fboSpec.size(); ndx++)
		log << TestLog::Message << "COLOR_ATTACHMENT" << ndx << ": "
								<< glu::getTextureFormatStr(m_fboSpec[ndx].format) << ", "
								<< m_fboSpec[ndx].width << "x" << m_fboSpec[ndx].height << ", "
								<< m_fboSpec[ndx].samples << " samples"
			<< TestLog::EndMessage;

	log << TestLog::EndSection;

	// Create framebuffer.
	m_renderbuffers.resize(m_fboSpec.size(), 0);
	gl.genFramebuffers(1, &m_framebuffer);
	gl.genRenderbuffers((int)m_renderbuffers.size(), &m_renderbuffers[0]);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);

	for (int bufNdx = 0; bufNdx < (int)m_renderbuffers.size(); bufNdx++)
	{
		deUint32			rbo			= m_renderbuffers[bufNdx];
		const BufferSpec&	bufSpec		= m_fboSpec[bufNdx];
		deUint32			attachment	= GL_COLOR_ATTACHMENT0+bufNdx;

		gl.bindRenderbuffer(GL_RENDERBUFFER, rbo);
		gl.renderbufferStorageMultisample(GL_RENDERBUFFER, bufSpec.samples, bufSpec.format, bufSpec.width, bufSpec.height);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, attachment, GL_RENDERBUFFER, rbo);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "After framebuffer setup");

	deUint32 fboStatus = gl.checkFramebufferStatus(GL_FRAMEBUFFER);
	if (fboStatus == GL_FRAMEBUFFER_UNSUPPORTED)
		throw tcu::NotSupportedError("Framebuffer not supported", "", __FILE__, __LINE__);
	else if (fboStatus != GL_FRAMEBUFFER_COMPLETE)
		throw tcu::TestError((string("Incomplete framebuffer: ") + glu::getFramebufferStatusStr(fboStatus).toString()).c_str(), "", __FILE__, __LINE__);

	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "After init");
}